

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O0

int anon_unknown.dwarf_17824::SMPI_Allreduce_Impl<unsigned_char>
              (uchar *sendbuf,uchar *recvbuf,int count,SMPI_Op op,SMPI_Comm comm)

{
  uchar *sendbuf_00;
  int in_ECX;
  int in_EDX;
  uchar *in_RSI;
  size_t in_RDI;
  undefined8 in_R8;
  Op op_00;
  string *in_stack_ffffffffffffff58;
  string *psVar1;
  undefined8 in_stack_ffffffffffffff60;
  Op op_01;
  size_t in_stack_ffffffffffffff68;
  uchar *in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff78;
  Comm *in_stack_ffffffffffffff80;
  string local_70 [48];
  string local_40 [64];
  
  op_01 = (Op)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  op_00 = (Op)((ulong)in_R8 >> 0x20);
  if (in_ECX == 0) {
    sendbuf_00 = (uchar *)(long)in_EDX;
    psVar1 = local_40;
    std::__cxx11::string::string(psVar1);
    adios2::helper::Comm::Allreduce<unsigned_char>
              ((Comm *)psVar1,sendbuf_00,in_RSI,in_RDI,op_00,in_stack_ffffffffffffff58);
    std::__cxx11::string::~string(local_40);
  }
  else if (in_ECX == 1) {
    psVar1 = local_70;
    std::__cxx11::string::string(psVar1);
    adios2::helper::Comm::Allreduce<unsigned_char>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,op_01,(string *)psVar1);
    std::__cxx11::string::~string(local_70);
  }
  return 0;
}

Assistant:

int SMPI_Allreduce_Impl(const T *sendbuf, T *recvbuf, int count, SMPI_Op op, SMPI_Comm comm)
{
    switch (op)
    {
#define F(op) comm->Allreduce(sendbuf, recvbuf, count, op)
        CASE_FOR_EACH_OP(F);
#undef F
    }
    return 0;
}